

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<unsigned_long_const&>
          (AssertionHandler *this,ExprLhs<const_unsigned_long_&> *expr)

{
  ITransientExpression local_20;
  unsigned_long *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = *local_10 != 0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d11f0;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }